

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

char * __thiscall
llvm::ItaniumPartialDemangler::getFunctionDeclContextName
          (ItaniumPartialDemangler *this,char *Buf,size_t *N)

{
  StringView R;
  bool bVar1;
  Kind KVar2;
  size_t sVar3;
  StringView local_78;
  long local_68;
  LocalName *LN;
  undefined1 local_50 [8];
  OutputStream S;
  Node *Name;
  size_t *N_local;
  char *Buf_local;
  ItaniumPartialDemangler *this_local;
  
  bVar1 = isFunction(this);
  if (bVar1) {
    S._24_8_ = anon_unknown.dwarf_4161a3::FunctionEncoding::getName
                         ((FunctionEncoding *)this->RootNode);
    OutputStream::OutputStream((OutputStream *)local_50);
    bVar1 = anon_unknown.dwarf_4161a3::initializeOutputStream(Buf,N,(OutputStream *)local_50,0x80);
    if (bVar1) {
      this_local = (ItaniumPartialDemangler *)0x0;
    }
    else {
      while( true ) {
        while( true ) {
          while (KVar2 = anon_unknown.dwarf_4161a3::Node::getKind((Node *)S._24_8_),
                KVar2 == KAbiTagAttr) {
            S._24_8_ = *(undefined8 *)(S._24_8_ + 0x10);
          }
          KVar2 = anon_unknown.dwarf_4161a3::Node::getKind((Node *)S._24_8_);
          if (KVar2 != KNameWithTemplateArgs) break;
          S._24_8_ = *(undefined8 *)(S._24_8_ + 0x10);
        }
        KVar2 = anon_unknown.dwarf_4161a3::Node::getKind((Node *)S._24_8_);
        if (KVar2 == KNestedName) {
          anon_unknown.dwarf_4161a3::Node::print
                    (*(Node **)(S._24_8_ + 0x10),(OutputStream *)local_50);
          goto LAB_003002ab;
        }
        if (KVar2 != KLocalName) break;
        local_68._0_4_ = S.CurrentPackIndex;
        local_68._4_4_ = S.CurrentPackMax;
        anon_unknown.dwarf_4161a3::Node::print(*(Node **)(S._24_8_ + 0x10),(OutputStream *)local_50)
        ;
        StringView::StringView(&local_78,"::");
        R.Last = local_78.Last;
        R.First = local_78.First;
        OutputStream::operator+=((OutputStream *)local_50,R);
        S._24_8_ = *(undefined8 *)(local_68 + 0x18);
      }
      if (KVar2 == KStdQualifiedName) {
        StringView::StringView((StringView *)&LN,"std");
        OutputStream::operator+=((OutputStream *)local_50,_LN);
      }
LAB_003002ab:
      OutputStream::operator+=((OutputStream *)local_50,'\0');
      if (N != (size_t *)0x0) {
        sVar3 = OutputStream::getCurrentPosition((OutputStream *)local_50);
        *N = sVar3;
      }
      this_local = (ItaniumPartialDemangler *)OutputStream::getBuffer((OutputStream *)local_50);
    }
  }
  else {
    this_local = (ItaniumPartialDemangler *)0x0;
  }
  return (char *)this_local;
}

Assistant:

char *ItaniumPartialDemangler::getFunctionDeclContextName(char *Buf,
                                                          size_t *N) const {
  if (!isFunction())
    return nullptr;
  Node *Name = static_cast<FunctionEncoding *>(RootNode)->getName();

  OutputStream S;
  if (initializeOutputStream(Buf, N, S, 128))
    return nullptr;

 KeepGoingLocalFunction:
  while (true) {
    if (Name->getKind() == Node::KAbiTagAttr) {
      Name = static_cast<AbiTagAttr *>(Name)->Base;
      continue;
    }
    if (Name->getKind() == Node::KNameWithTemplateArgs) {
      Name = static_cast<NameWithTemplateArgs *>(Name)->Name;
      continue;
    }
    break;
  }

  switch (Name->getKind()) {
  case Node::KStdQualifiedName:
    S += "std";
    break;
  case Node::KNestedName:
    static_cast<NestedName *>(Name)->Qual->print(S);
    break;
  case Node::KLocalName: {
    auto *LN = static_cast<LocalName *>(Name);
    LN->Encoding->print(S);
    S += "::";
    Name = LN->Entity;
    goto KeepGoingLocalFunction;
  }
  default:
    break;
  }
  S += '\0';
  if (N != nullptr)
    *N = S.getCurrentPosition();
  return S.getBuffer();
}